

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_phone_list.c
# Opt level: O2

void print_phone_list(acmod_id_t *p,uint32 n_p,char *btw,acmod_set_t *acmod_set)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  char fmt [16];
  
  uVar6 = 0;
  for (uVar7 = 0; n_p != uVar7; uVar7 = uVar7 + 1) {
    pcVar2 = acmod_set_id2name(acmod_set,p[uVar7]);
    sVar3 = strlen(pcVar2);
    uVar1 = (uint)sVar3;
    if ((uint)sVar3 < uVar6) {
      uVar1 = uVar6;
    }
    uVar6 = uVar1;
  }
  sprintf(fmt,"%%%ds%%s",(ulong)uVar6);
  uVar1 = 0;
  while (uVar7 = (ulong)n_p, uVar1 < n_p) {
    uVar4 = (int)(0x50 / (ulong)uVar6) + uVar1;
    if (uVar4 < n_p) {
      uVar7 = (ulong)uVar4;
    }
    uVar5 = (ulong)uVar1;
    for (uVar8 = uVar5; uVar8 < uVar7; uVar8 = uVar8 + 1) {
      pcVar2 = " ";
      if (btw[uVar8] != '\0') {
        pcVar2 = "+";
      }
      printf(fmt,"",pcVar2);
    }
    putchar(10);
    for (; uVar5 < uVar7; uVar5 = uVar5 + 1) {
      pcVar2 = acmod_set_id2name(acmod_set,p[uVar5]);
      printf(fmt,pcVar2," ");
    }
    putchar(10);
    putchar(10);
    uVar1 = uVar4;
  }
  return;
}

Assistant:

void
print_phone_list(acmod_id_t *p,
		 uint32 n_p,
		 char *btw,
		 acmod_set_t *acmod_set)
{
    uint32 i, j, k;
    uint32 mpl, l;
    char fmt[16];
    uint32 ppl;

    for (i = 0, mpl = 0; i < n_p; i++) {
	l = strlen(acmod_set_id2name(acmod_set, p[i]));
	if (l > mpl) mpl = l;
    }

    sprintf(fmt, "%%%ds%%s", mpl);

    ppl = 80 / mpl;

    /* print out the phone sequence in rows of at most PPL phones */
    for (i = 0; i < n_p; i += ppl) {
	for (j = i, k = (i + ppl > n_p ? n_p : i + ppl); j < k; j++) {
	    printf(fmt, "", (btw[j] ? "+" : " "));
	}
	printf("\n");

	for (j = i, k = (i + ppl > n_p ? n_p : i + ppl); j < k; j++) {
	    printf(fmt, acmod_set_id2name(acmod_set, p[j]), " ");
	}
	printf("\n");
	printf("\n");
    }
}